

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_enumerator.cpp
# Opt level: O2

bool __thiscall
duckdb::PlanEnumerator::EnumerateCSGRecursive
          (PlanEnumerator *this,JoinRelationSet *node,
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *exclusion_set)

{
  bool bVar1;
  bool bVar2;
  JoinRelationSet *pJVar3;
  iterator iVar4;
  reference pvVar5;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *rel_set;
  pointer bindings;
  unsigned_long *neighbor;
  pointer __v;
  ulong __n;
  vector<std::reference_wrapper<duckdb::JoinRelationSet>,_true> union_sets;
  vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_true>
  all_subset;
  vector<unsigned_long,_true> neighbors;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_80;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  new_exclusion_set;
  
  QueryGraphEdges::GetNeighbors(&neighbors,this->query_graph,node,exclusion_set);
  if (neighbors.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start ==
      neighbors.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar1 = true;
  }
  else {
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_80,
               &neighbors.super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
    GetAllNeighborSets(&all_subset,(vector<unsigned_long,_true> *)&local_80);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_80);
    union_sets.
    super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    union_sets.
    super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    union_sets.
    super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::
    vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
    ::reserve(&union_sets.
               super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
              ,((long)all_subset.
                      super_vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                      .
                      super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)all_subset.
                     super_vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                     .
                     super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x38);
    for (bindings = all_subset.
                    super_vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                    .
                    super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        bindings !=
        all_subset.
        super_vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
        .
        super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; bindings = bindings + 1) {
      pJVar3 = JoinRelationSetManager::GetJoinRelation
                         (&this->query_graph_manager->set_manager,bindings);
      pJVar3 = JoinRelationSetManager::Union(&this->query_graph_manager->set_manager,node,pJVar3);
      new_exclusion_set._M_h._M_buckets = (__buckets_ptr)pJVar3;
      iVar4 = ::std::
              _Hashtable<std::reference_wrapper<duckdb::JoinRelationSet>,_std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::JoinRelationSet>,_duckdb::ReferenceHashFunction<duckdb::JoinRelationSet>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->plans)._M_h,(key_type *)&new_exclusion_set);
      if (iVar4.
          super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::JoinRelationSet>,_duckdb::unique_ptr<duckdb::DPJoinNode,_std::default_delete<duckdb::DPJoinNode>,_true>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        bVar1 = EmitCSG(this,pJVar3);
        if (!bVar1) {
          bVar1 = false;
          goto LAB_01a5fdca;
        }
      }
      new_exclusion_set._M_h._M_buckets = (__buckets_ptr)pJVar3;
      ::std::
      vector<std::reference_wrapper<duckdb::JoinRelationSet>,std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>>>
      ::emplace_back<std::reference_wrapper<duckdb::JoinRelationSet>>
                ((vector<std::reference_wrapper<duckdb::JoinRelationSet>,std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>>>
                  *)&union_sets,(reference_wrapper<duckdb::JoinRelationSet> *)&new_exclusion_set);
    }
    ::std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_Hashtable(&new_exclusion_set._M_h,&exclusion_set->_M_h);
    for (__v = neighbors.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
        __v != neighbors.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish; __v = __v + 1) {
      ::std::__detail::
      _Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&new_exclusion_set,__v);
    }
    __n = 0;
    do {
      bVar1 = (ulong)((long)union_sets.
                            super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                            .
                            super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)union_sets.
                            super_vector<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                            .
                            super__Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) <= __n;
      if (bVar1) break;
      pvVar5 = vector<std::reference_wrapper<duckdb::JoinRelationSet>,_true>::get<true>
                         (&union_sets,__n);
      bVar2 = EnumerateCSGRecursive(this,pvVar5->_M_data,&new_exclusion_set);
      __n = __n + 1;
    } while (bVar2);
    ::std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&new_exclusion_set._M_h);
LAB_01a5fdca:
    ::std::
    _Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
    ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::JoinRelationSet>,_std::allocator<std::reference_wrapper<duckdb::JoinRelationSet>_>_>
                     *)&union_sets);
    ::std::
    vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
    ::~vector(&all_subset.
               super_vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
             );
  }
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&neighbors);
  return bVar1;
}

Assistant:

bool PlanEnumerator::EnumerateCSGRecursive(JoinRelationSet &node, unordered_set<idx_t> &exclusion_set) {
	// find neighbors of S under the exclusion set
	auto neighbors = query_graph.GetNeighbors(node, exclusion_set);
	if (neighbors.empty()) {
		return true;
	}

	auto all_subset = GetAllNeighborSets(neighbors);
	vector<reference<JoinRelationSet>> union_sets;
	union_sets.reserve(all_subset.size());
	for (const auto &rel_set : all_subset) {
		auto &neighbor = query_graph_manager.set_manager.GetJoinRelation(rel_set);
		// emit the combinations of this node and its neighbors
		auto &new_set = query_graph_manager.set_manager.Union(node, neighbor);
		D_ASSERT(new_set.count > node.count);
		if (plans.find(new_set) != plans.end()) {
			if (!EmitCSG(new_set)) {
				return false;
			}
		}
		union_sets.push_back(new_set);
	}

	unordered_set<idx_t> new_exclusion_set = exclusion_set;
	for (const auto &neighbor : neighbors) {
		new_exclusion_set.insert(neighbor);
	}

	// recursively enumerate the sets
	for (idx_t i = 0; i < union_sets.size(); i++) {
		// updated the set of excluded entries with this neighbor
		if (!EnumerateCSGRecursive(union_sets[i], new_exclusion_set)) {
			return false;
		}
	}
	return true;
}